

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Gc::resumeTheWorld(Gc *this)

{
  void *__stat_loc;
  size_t i;
  ulong uVar1;
  
  __stat_loc = (void *)0x3;
  axl::io::psx::Mapping::protect(&this->m_guardPage,3);
  this->m_handshakeKind = HandshakeKind_ResumeTheWorld;
  this->m_handshakeCounter =
       (int32_t)(this->m_threadArray).
                super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_count;
  for (uVar1 = 0; uVar1 < (ulong)(long)this->m_handshakeCounter; uVar1 = uVar1 + 1) {
    __stat_loc = (void *)0xa;
    pthread_kill((this->m_threadArray).
                 super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>.m_p[uVar1],10)
    ;
  }
  axl::sys::psx::Sem::wait(&this->m_handshakeSem,__stat_loc);
  this->m_handshakeKind = HandshakeKind_None;
  return;
}

Assistant:

void
	resumeTheWorld() {
		m_guardPage.protect(PROT_READ | PROT_WRITE);

		m_handshakeKind = HandshakeKind_ResumeTheWorld;
		m_handshakeCounter = m_threadArray.getCount();
		for (size_t i = 0; i < m_handshakeCounter; i++)
			pthread_kill((pthread_t)m_threadArray[i], SIGUSR1); // resume

		m_handshakeSem.wait();
		m_handshakeKind = HandshakeKind_None;
	}